

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIrrDeviceSDL.cpp
# Opt level: O0

bool __thiscall irr::CIrrDeviceSDL::isWindowActive(CIrrDeviceSDL *this)

{
  uint uVar1;
  long in_RDI;
  u32 windowFlags;
  bool local_d;
  
  uVar1 = SDL_GetWindowFlags(*(undefined8 *)(in_RDI + 0xf8));
  local_d = (uVar1 & 4) != 0 && (uVar1 & 0x200) != 0;
  return local_d;
}

Assistant:

bool CIrrDeviceSDL::isWindowActive() const
{
#ifdef _IRR_EMSCRIPTEN_PLATFORM_
	// Hidden test only does something in some browsers (when tab in background or window is minimized)
	// In other browsers code automatically doesn't seem to be called anymore.
	EmscriptenVisibilityChangeEvent emVisibility;
	if (emscripten_get_visibility_status(&emVisibility) == EMSCRIPTEN_RESULT_SUCCESS) {
		if (emVisibility.hidden)
			return false;
	}
#endif
	const u32 windowFlags = SDL_GetWindowFlags(Window);
	return windowFlags & SDL_WINDOW_SHOWN && windowFlags & SDL_WINDOW_INPUT_FOCUS;
}